

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

void __thiscall
Annotator_clearAllIdsModelPresent_Test::TestBody(Annotator_clearAllIdsModelPresent_Test *this)

{
  char cVar1;
  char *pcVar2;
  AnyCellmlElementPtr item;
  AssertionResult gtest_ar;
  AnnotatorPtr annotator;
  ModelPtr model;
  ParserPtr parser;
  long *local_80;
  long *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  CellmlElementType local_68 [2];
  long *local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  long local_50 [2];
  shared_ptr *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  undefined1 local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Parser::create(SUB81(local_20,0));
  libcellml::Parser::parseModel(local_30);
  libcellml::Annotator::create();
  libcellml::Annotator::clearAllIds(local_40);
  local_78 = (long *)0x0;
  local_80 = (long *)libcellml::Logger::errorCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_60,"size_t(0)","annotator->errorCount()",(unsigned_long *)&local_78,
             (unsigned_long *)&local_80);
  if (local_60._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x68f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_78 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_78 != (long *)0x0)) {
        (**(code **)(*local_78 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"duplicateId","");
  libcellml::Annotator::item((string *)&local_78);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  local_80 = (long *)CONCAT44(local_80._4_4_,0xb);
  local_68[0] = libcellml::AnyCellmlElement::type();
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)&local_60,"libcellml::CellmlElementType::UNDEFINED","item->type()",
             (CellmlElementType *)&local_80,local_68);
  if (local_60._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x692,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if (local_80 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Annotator, clearAllIdsModelPresent)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringDuplicateIds);
    auto annotator = libcellml::Annotator::create();

    annotator->clearAllIds(model);
    EXPECT_EQ(size_t(0), annotator->errorCount());

    auto item = annotator->item("duplicateId");
    EXPECT_EQ(libcellml::CellmlElementType::UNDEFINED, item->type());
}